

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

void __thiscall AixLog::SinkCout::~SinkCout(SinkCout *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_SinkFormat).super_Sink._vptr_Sink = (_func_int **)&PTR__SinkFormat_001eed20;
  pcVar2 = (this->super_SinkFormat).format_._M_dataplus._M_p;
  paVar1 = &(this->super_SinkFormat).format_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_SinkFormat).super_Sink._vptr_Sink = (_func_int **)&PTR__Sink_001eed58;
  std::
  _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
  ::~_Rb_tree((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
               *)&(this->super_SinkFormat).super_Sink.filter);
  operator_delete(this,0x58);
  return;
}

Assistant:

SinkCout(const Filter& filter,
           const std::string& format =
               "%Y-%m-%d %H-%M-%S.#ms [#severity] (#tag_func)")
      : SinkFormat(filter, format) {}